

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TUDPTransport.h
# Opt level: O1

void __thiscall jaegertracing::testutils::TUDPTransport::~TUDPTransport(TUDPTransport *this)

{
  int in_ESI;
  
  (this->
  super_TVirtualTransport<jaegertracing::testutils::TUDPTransport,_apache::thrift::transport::TTransportDefaults>
  ).super_TTransportDefaults.super_TTransport._vptr_TTransport =
       (_func_int **)&PTR__TUDPTransport_00159a50;
  net::Socket::close(&this->_socket,in_ESI);
  jaegertracing::net::Socket::OSResource::~OSResource(&(this->_socket)._osResource);
  return;
}

Assistant:

explicit TUDPTransport(const net::IPAddress& addr)
        : _socket()
        , _serverAddr(addr)
    {
        _socket.open(AF_INET, SOCK_DGRAM);
        _socket.bind(_serverAddr);
        if (_serverAddr.port() == 0) {
            ::sockaddr_storage addrStorage;
            ::socklen_t addrLen = sizeof(addrStorage);
            const auto returnCode =
                ::getsockname(_socket.handle(),
                              reinterpret_cast<::sockaddr*>(&addrStorage),
                              &addrLen);
            if (returnCode == 0) {
                _serverAddr = net::IPAddress(addrStorage, addrLen);
            }
        }
    }